

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O3

void show_help(FILE *fp)

{
  fputs("  =================================================\n     THIS SSH SERVER IS NOT WRITTEN TO BE SECURE!\n  DO NOT DEPLOY IT IN A HOSTILE-FACING ENVIRONMENT!\n  =================================================\n"
        ,(FILE *)fp);
  fputs("\nusage:   uppity [options] [--and <options>...]\noptions: --listen [PORT|PATH] listen to a port on localhost, or Unix socket\n         --listen-once        (with --listen) stop after one connection\n         --hostkey KEY        SSH host key (need at least one)\n         --rsakexkey KEY      key for SSH-2 RSA key exchange (in SSH-1 format)\n         --userkey KEY        public key acceptable for user authentication\n         --sessiondir DIR     cwd for session subprocess (default $HOME)\n         --bannertext TEXT    send TEXT as SSH-2 auth banner\n         --bannerfile FILE    send contents of FILE as SSH-2 auth banner\n         --kexinit-kex STR    override list of SSH-2 KEX methods\n         --kexinit-hostkey STR  override list of SSH-2 host key types\n         --kexinit-cscipher STR override list of SSH-2 client->server ciphers\n         --kexinit-sccipher STR override list of SSH-2 server->client ciphers\n         --kexinit-csmac STR    override list of SSH-2 client->server MACs\n         --kexinit-scmac STR    override list of SSH-2 server->client MACs\n         --kexinit-cscomp STR   override list of SSH-2 c->s compression types\n         --kexinit-sccomp STR   override list of SSH-2 s->c compression types\n         --ssh1-ciphers STR     override list of SSH-1 ciphers\n         --ssh1-no-compression  forbid compression in SSH-1\n         --deny-auth METHOD   forbid a userauth method\n         --allow-auth METHOD  allow a userauth method\n                 (METHOD = none/password/publickey/kbdint/tis/cryptocard)\n         --exitsignum         send buggy numeric \"exit-signal\" message\n         --verbose            print event log messages to standard error\n         --sshlog FILE        write SSH packet log to FILE\n         --sshrawlog FILE     write SSH packets + raw data log to FILE\n         --and                run a separate server on another port\nalso:    uppity --help        show this text\n         uppity --version     show version information\n\n"
        ,(FILE *)fp);
  fputs("  =================================================\n     THIS SSH SERVER IS NOT WRITTEN TO BE SECURE!\n  DO NOT DEPLOY IT IN A HOSTILE-FACING ENVIRONMENT!\n  =================================================\n"
        ,(FILE *)fp);
  return;
}

Assistant:

static void show_help(FILE *fp)
{
    safety_warning(fp);
    fputs("\n"
          "usage:   uppity [options] [--and <options>...]\n"
          "options: --listen [PORT|PATH] listen to a port on localhost, or Unix socket\n"
          "         --listen-once        (with --listen) stop after one "
          "connection\n"
          "         --hostkey KEY        SSH host key (need at least one)\n"
          "         --rsakexkey KEY      key for SSH-2 RSA key exchange "
          "(in SSH-1 format)\n"
          "         --userkey KEY        public key"
           " acceptable for user authentication\n"
          "         --sessiondir DIR     cwd for session subprocess (default $HOME)\n"
          "         --bannertext TEXT    send TEXT as SSH-2 auth banner\n"
          "         --bannerfile FILE    send contents of FILE as SSH-2 auth "
          "banner\n"
          "         --kexinit-kex STR    override list of SSH-2 KEX methods\n"
          "         --kexinit-hostkey STR  override list of SSH-2 host key "
          "types\n"
          "         --kexinit-cscipher STR override list of SSH-2 "
          "client->server ciphers\n"
          "         --kexinit-sccipher STR override list of SSH-2 "
          "server->client ciphers\n"
          "         --kexinit-csmac STR    override list of SSH-2 "
          "client->server MACs\n"
          "         --kexinit-scmac STR    override list of SSH-2 "
          "server->client MACs\n"
          "         --kexinit-cscomp STR   override list of SSH-2 "
          "c->s compression types\n"
          "         --kexinit-sccomp STR   override list of SSH-2 "
          "s->c compression types\n"
          "         --ssh1-ciphers STR     override list of SSH-1 ciphers\n"
          "         --ssh1-no-compression  forbid compression in SSH-1\n"
          "         --deny-auth METHOD   forbid a userauth method\n"
          "         --allow-auth METHOD  allow a userauth method\n"
          "                 (METHOD = none/password/publickey/kbdint/tis/"
          "cryptocard)\n"
          "         --exitsignum         send buggy numeric \"exit-signal\" "
          "message\n"
          "         --verbose            print event log messages to standard "
          "error\n"
          "         --sshlog FILE        write SSH packet log to FILE\n"
          "         --sshrawlog FILE     write SSH packets + raw data log"
          " to FILE\n"
          "         --and                run a separate server on another port\n"
          "also:    uppity --help        show this text\n"
          "         uppity --version     show version information\n"
          "\n", fp);
    safety_warning(fp);
}